

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_AT_BT_x86
              (Mat *AT,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int M,int N,int K,
              int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
              int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppi;
  Mat topT;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int in_stack_00003f30;
  int in_stack_00003f38;
  int in_stack_00003f40;
  int in_stack_00003f48;
  int in_stack_00003f50;
  int in_stack_00003f58;
  undefined4 in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  int in_stack_fffffffffffff854;
  int in_stack_fffffffffffff858;
  int in_stack_fffffffffffff85c;
  Mat *in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff8a0;
  void **ppvVar2;
  int in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  undefined8 in_stack_fffffffffffff8b0;
  int *in_stack_fffffffffffff8c0;
  int *in_stack_fffffffffffff8c8;
  Mat *in_stack_fffffffffffff8d0;
  Mat *in_stack_fffffffffffff8d8;
  void **in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  Mat *in_stack_fffffffffffff8f8;
  void **local_700;
  int local_6a0 [8];
  Allocator *local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined8 local_660;
  void *local_658;
  int *local_650;
  size_t local_648;
  int local_640;
  Allocator *local_638;
  undefined4 local_630;
  int local_62c;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  long local_618;
  Mat local_610;
  void *local_5c8;
  int *local_5c0;
  size_t local_5b8;
  int local_5b0;
  Allocator *local_5a8;
  undefined4 local_5a0;
  int local_59c;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  long local_588;
  int local_57c;
  int local_578;
  int local_574;
  void **local_570;
  int local_564;
  int local_560;
  int local_55c;
  void *local_558;
  int *local_550;
  ulong local_548;
  undefined4 local_540;
  long *local_538;
  int local_530;
  int local_52c;
  int local_528;
  undefined4 local_524;
  undefined4 local_520;
  ulong local_518;
  void *local_510;
  int *local_508;
  void *local_500;
  undefined4 local_4f8;
  long *local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  void *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  void *local_4a8;
  int *local_4a0;
  ulong local_498;
  undefined4 local_490;
  long *local_488;
  int local_480;
  int local_47c;
  int local_478;
  undefined4 local_474;
  undefined4 local_470;
  long local_468;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  void **local_440;
  Mat *local_438;
  Mat *local_430;
  void **local_428;
  void **local_420;
  void **local_418;
  Mat *local_408;
  int *local_3f8;
  void **local_3e8;
  void **local_3d8;
  void **local_3c8;
  void **local_3b8;
  undefined1 local_3a5;
  int local_3a4;
  void **local_3a0;
  void **local_398;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int *local_2e0;
  Mat *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  void **local_290;
  void **local_288;
  void **local_280;
  int local_278;
  undefined4 local_274;
  void **local_270;
  long *local_268;
  undefined4 local_25c;
  ulong local_258;
  void *local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  void **local_238;
  undefined4 local_22c;
  long local_228;
  void *local_220;
  void *local_218;
  void *local_1e8;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  undefined1 local_19d;
  int local_19c;
  int *local_190;
  Allocator *local_170;
  int local_164;
  size_t local_160;
  void *local_158;
  int local_14c;
  int local_148;
  int local_144;
  int *local_140;
  undefined4 local_134;
  long local_130;
  undefined1 local_11d;
  int local_11c;
  Mat *local_110;
  Allocator *local_f0;
  int local_e4;
  size_t local_e0;
  void *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  Mat *local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined4 local_a0;
  int local_9c;
  int *local_98;
  void **local_90;
  Allocator *local_88;
  int local_7c;
  size_t local_78;
  void *local_70;
  undefined4 local_68;
  int local_64;
  void **local_60;
  undefined4 local_58;
  int local_54;
  Mat *local_50;
  void **local_48;
  Allocator *local_40;
  int local_34;
  size_t local_30;
  void *local_28;
  undefined4 local_20;
  int local_1c;
  void **local_18;
  
  local_450 = in_R9D;
  local_44c = in_R8D;
  local_440 = in_RDX;
  local_438 = in_RSI;
  local_430 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff8b0 >> 0x20),(int)in_stack_fffffffffffff8b0,
             in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8,
             (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),(int)in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,(int *)in_stack_fffffffffffff8d0,
             (int)in_stack_fffffffffffff8d8);
  local_460 = (local_450 + local_454 + -1) / local_454;
  local_428 = &local_4a8;
  local_4a8 = (void *)0x0;
  local_4a0 = (int *)0x0;
  local_498 = 0;
  local_490 = 0;
  local_488 = (long *)0x0;
  local_480 = 0;
  local_47c = 0;
  local_478 = 0;
  local_474 = 0;
  local_470 = 0;
  local_468 = 0;
  if (((local_45c < in_stack_00000010) || (local_44c == 3)) || (in_stack_00000018 != 0)) {
    Mat::create(in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff858,
                in_stack_fffffffffffff854,
                CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                (Allocator *)CONCAT44(in_stack_fffffffffffff844,in_stack_00000038));
  }
  for (local_4b8 = 0; local_4b8 < local_460; local_4b8 = local_4b8 + 1) {
    local_4bc = local_4b8 * local_454;
    local_4c4 = local_450 - local_4bc;
    piVar1 = std::min<int>(&local_4c4,&local_454);
    local_4c0 = *piVar1;
    local_420 = &local_510;
    local_510 = (void *)0x0;
    local_508 = (int *)0x0;
    local_500 = (void *)0x0;
    local_4f8 = 0;
    local_4f0 = (long *)0x0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = (void *)0x0;
    if (((local_45c < in_stack_00000010) || (local_44c == 3)) || (in_stack_00000018 != 0)) {
      local_3a4 = get_omp_thread_num();
      local_398 = &local_558;
      local_3a0 = &local_4a8;
      local_250 = (void *)((long)local_4a8 + local_468 * local_3a4 * local_498);
      local_238 = &local_558;
      local_558 = local_250;
      local_550 = (int *)0x0;
      local_548 = local_498;
      local_540 = local_490;
      local_538 = local_488;
      local_52c = local_47c;
      local_528 = local_478;
      local_524 = 1;
      local_520 = local_474;
      local_228 = (long)local_47c * (long)local_478 * local_498;
      local_518 = (local_228 + 0xfU & 0xfffffffffffffff0) / local_498;
      local_530 = local_480 + -1;
      if (local_480 == 4) {
        local_518 = (long)local_47c * (long)local_478;
      }
      local_22c = 0x10;
      local_23c = local_47c;
      local_240 = local_478;
      local_244 = local_474;
      local_258 = local_498;
      local_25c = local_490;
      local_268 = local_488;
      local_3a5 = 1;
      local_290 = &local_558;
      local_288 = &local_510;
      if (&local_510 != local_290) {
        local_270 = &local_510;
        if (local_508 != (int *)0x0) {
          local_274 = 0xffffffff;
          LOCK();
          local_278 = *local_508;
          *local_508 = *local_508 + -1;
          UNLOCK();
          if (local_278 == 1) {
            if (local_4f0 == (long *)0x0) {
              local_220 = local_510;
              if (local_510 != (void *)0x0) {
                free(local_510);
              }
            }
            else {
              (**(code **)(*local_4f0 + 0x18))(local_4f0,local_510);
            }
          }
        }
        local_510 = (void *)0x0;
        local_500 = (void *)0x0;
        local_4f8 = 0;
        local_4e8 = 0;
        local_4e4 = 0;
        local_4e0 = 0;
        local_4dc = 0;
        local_4d8 = 0;
        local_4d0 = (void *)0x0;
        local_508 = (int *)0x0;
        local_510 = *local_290;
        local_508 = (int *)local_290[1];
        local_500 = local_290[2];
        local_4f8 = *(undefined4 *)(local_290 + 3);
        local_4f0 = (long *)local_290[4];
        local_4e8 = *(undefined4 *)(local_290 + 5);
        local_4e4 = *(undefined4 *)((long)local_290 + 0x2c);
        local_4e0 = *(undefined4 *)(local_290 + 6);
        local_4dc = *(undefined4 *)((long)local_290 + 0x34);
        local_4d8 = *(undefined4 *)(local_290 + 7);
        local_4d0 = local_290[8];
      }
      local_418 = &local_558;
      local_2a0 = local_418;
      local_280 = &local_510;
      if (local_550 != (int *)0x0) {
        local_2a4 = 0xffffffff;
        LOCK();
        local_2a8 = *local_550;
        *local_550 = *local_550 + -1;
        UNLOCK();
        if (local_2a8 == 1) {
          if (local_538 == (long *)0x0) {
            local_218 = local_558;
            if (local_558 != (void *)0x0) {
              free(local_558);
            }
          }
          else {
            (**(code **)(*local_538 + 0x18))(local_538,local_558);
          }
        }
      }
      local_558 = (void *)0x0;
      local_548 = 0;
      local_540 = 0;
      local_530 = 0;
      local_52c = 0;
      local_528 = 0;
      local_524 = 0;
      local_520 = 0;
      local_518 = 0;
      local_550 = (int *)0x0;
    }
    for (local_55c = 0; local_55c < in_stack_00000008; local_55c = local_458 + local_55c) {
      local_564 = in_stack_00000008 - local_55c;
      piVar1 = std::min<int>(&local_564,&local_458);
      local_560 = *piVar1;
      if (local_44c == 3) {
        pack_A_tile(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                    (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),(int)in_stack_fffffffffffff8e8,
                    (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20),(int)in_stack_fffffffffffff8e0);
      }
      if (local_44c == 3) {
        local_700 = &local_510;
      }
      else {
        local_700 = local_440;
      }
      local_570 = local_700;
      for (local_574 = 0; local_574 < in_stack_00000010; local_574 = local_45c + local_574) {
        local_57c = in_stack_00000010 - local_574;
        piVar1 = std::min<int>(&local_57c,&local_45c);
        local_578 = *piVar1;
        local_11c = local_4bc / local_454;
        local_110 = &local_610;
        local_c4 = local_430->w;
        local_c8 = local_430->h;
        local_cc = local_430->d;
        local_d8 = (void *)((long)local_430->data +
                           local_430->cstep * (long)local_11c * local_430->elemsize);
        local_e0 = local_430->elemsize;
        local_e4 = local_430->elempack;
        local_f0 = local_430->allocator;
        in_stack_fffffffffffff8f0 = &local_610;
        local_b0 = (long)local_c4 * (long)local_c8 * local_e0;
        local_54 = local_574 / local_45c;
        local_48 = &local_5c8;
        local_50 = &local_610;
        local_28 = (void *)((long)local_d8 + (long)local_c4 * (long)local_54 * local_e0);
        in_stack_fffffffffffff8e0 = &local_5c8;
        local_588 = (long)local_c4;
        in_stack_fffffffffffff8d8 = &local_610;
        local_19c = local_55c / local_458;
        local_190 = local_6a0;
        local_144 = local_438->w;
        local_148 = local_438->h;
        local_14c = local_438->d;
        local_158 = (void *)((long)local_438->data +
                            local_438->cstep * (long)local_19c * local_438->elemsize);
        local_160 = local_438->elemsize;
        local_164 = local_438->elempack;
        local_170 = local_438->allocator;
        in_stack_fffffffffffff8c8 = local_6a0;
        local_130 = (long)local_144 * (long)local_148 * local_160;
        local_9c = local_574 / local_45c;
        local_90 = &local_658;
        local_98 = local_6a0;
        local_70 = (void *)((long)local_158 + (long)local_144 * (long)local_9c * local_160);
        local_60 = &local_658;
        local_618 = (long)local_144;
        local_3f8 = local_6a0;
        local_590 = 1;
        local_594 = 1;
        local_598 = 1;
        local_5a0 = 2;
        local_5c0 = (int *)0x0;
        local_610.c = 0;
        local_610.d = 0;
        local_610.h = 0;
        local_610.w = 0;
        local_610.elempack = 0;
        local_610.elemsize = 0;
        local_610.refcount = (int *)0x0;
        local_610.data = (void *)0x0;
        local_620 = 1;
        local_624 = 1;
        local_628 = 1;
        local_630 = 2;
        local_650 = (int *)0x0;
        local_20 = 1;
        local_58 = 1;
        local_68 = 1;
        local_a0 = 1;
        local_b4 = 0x10;
        local_11d = 1;
        local_134 = 0x10;
        local_19d = 1;
        local_610.cstep = 0;
        local_610.dims = 0;
        local_6a0[0] = 0;
        local_6a0[1] = 0;
        local_6a0[4] = 0;
        local_6a0[5] = 0;
        local_6a0[6] = 0;
        local_678 = 0;
        local_674 = 0;
        local_670 = 0;
        local_66c = 0;
        local_668 = 0;
        local_660 = 0;
        local_6a0[2] = 0;
        local_6a0[3] = 0;
        in_stack_fffffffffffff8d0 = local_438;
        in_stack_fffffffffffff8f8 = local_430;
        local_408 = in_stack_fffffffffffff8d8;
        local_2e0 = local_3f8;
        local_2c0 = in_stack_fffffffffffff8d8;
        local_140 = in_stack_fffffffffffff8c8;
        local_c0 = in_stack_fffffffffffff8f0;
        local_88 = local_170;
        local_7c = local_164;
        local_78 = local_160;
        local_64 = local_144;
        local_40 = local_f0;
        local_34 = local_e4;
        local_30 = local_e0;
        local_1c = local_c4;
        local_18 = in_stack_fffffffffffff8e0;
        local_680 = local_170;
        local_658 = local_70;
        local_648 = local_160;
        local_640 = local_164;
        local_638 = local_170;
        local_62c = local_144;
        local_610.allocator = local_f0;
        local_5c8 = local_28;
        local_5b8 = local_e0;
        local_5b0 = local_e4;
        local_5a8 = local_f0;
        local_59c = local_c4;
        gemm_transB_packed_tile
                  (BT,C,top_blob,(Mat *)CONCAT44(broadcast_type_C,M),_TILE_N,TILE_K,
                   in_stack_00003f30,in_stack_00003f38,in_stack_00003f40,in_stack_00003f48,
                   in_stack_00003f50,in_stack_00003f58,nn_M._3_1_);
        ppvVar2 = &local_658;
        local_3e8 = ppvVar2;
        local_300 = ppvVar2;
        if (local_650 != (int *)0x0) {
          local_304 = 0xffffffff;
          LOCK();
          local_308 = *local_650;
          *local_650 = *local_650 + -1;
          UNLOCK();
          if (local_308 == 1) {
            if (local_638 == (Allocator *)0x0) {
              local_1e8 = local_658;
              if (local_658 != (void *)0x0) {
                free(local_658);
              }
            }
            else {
              (*local_638->_vptr_Allocator[3])(local_638,local_658);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
        local_3d8 = &local_5c8;
        local_320 = local_3d8;
        if (local_5c0 != (int *)0x0) {
          local_324 = 0xffffffff;
          LOCK();
          local_328 = *local_5c0;
          *local_5c0 = *local_5c0 + -1;
          UNLOCK();
          if (local_328 == 1) {
            if (local_5a8 == (Allocator *)0x0) {
              local_1d8 = local_5c8;
              if (local_5c8 != (void *)0x0) {
                free(local_5c8);
              }
            }
            else {
              (*local_5a8->_vptr_Allocator[3])(local_5a8,local_5c8);
            }
          }
        }
        local_5c8 = (void *)0x0;
        local_5b8 = 0;
        local_5b0 = 0;
        local_5a0 = 0;
        local_59c = 0;
        local_598 = 0;
        local_594 = 0;
        local_590 = 0;
        local_588 = 0;
        local_5c0 = (int *)0x0;
      }
      if (in_stack_00000018 != 0) {
        transpose_unpack_output_tile
                  (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                   (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(int)in_stack_fffffffffffff8c8,
                   (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),(int)in_stack_fffffffffffff8c0);
      }
    }
    local_3c8 = &local_510;
    local_340 = local_3c8;
    if (local_508 != (int *)0x0) {
      local_344 = 0xffffffff;
      LOCK();
      local_348 = *local_508;
      *local_508 = *local_508 + -1;
      UNLOCK();
      if (local_348 == 1) {
        if (local_4f0 == (long *)0x0) {
          local_1c8 = local_510;
          if (local_510 != (void *)0x0) {
            free(local_510);
          }
        }
        else {
          (**(code **)(*local_4f0 + 0x18))(local_4f0,local_510);
        }
      }
    }
    local_510 = (void *)0x0;
    local_500 = (void *)0x0;
    local_4f8 = 0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = (void *)0x0;
    local_508 = (int *)0x0;
  }
  local_3b8 = &local_4a8;
  if (local_4a0 != (int *)0x0) {
    local_364 = 0xffffffff;
    LOCK();
    local_368 = *local_4a0;
    *local_4a0 = *local_4a0 + -1;
    UNLOCK();
    if (local_368 == 1) {
      local_360 = local_3b8;
      if (local_488 == (long *)0x0) {
        local_1b8 = local_4a8;
        if (local_4a8 != (void *)0x0) {
          free(local_4a8);
        }
      }
      else {
        (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
      }
    }
  }
  return 0;
}

Assistant:

static int gemm_AT_BT_x86(const Mat& AT, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int N, int K, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}